

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::apply_undo(CVmObjLookupTable *this,CVmUndoRecord *undo_rec)

{
  undefined4 *__ptr;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_lookup_val *pvVar3;
  lookuptab_undo_rec *rec;
  
  __ptr = (undefined4 *)(undo_rec->id).ptrval;
  if (__ptr == (undefined4 *)0x0) {
    return;
  }
  switch(*__ptr) {
  case 1:
    del_entry(this,(vm_val_t *)(__ptr + 2));
    break;
  case 2:
    add_entry(this,(vm_val_t *)(__ptr + 2),&undo_rec->oldval);
    break;
  case 3:
    pvVar3 = find_entry(this,(vm_val_t *)(__ptr + 2),(uint *)0x0,(vm_lookup_val **)0x0);
    if (pvVar3 == (vm_lookup_val *)0x0) break;
    goto LAB_0029c3ab;
  case 4:
    pvVar3 = (vm_lookup_val *)(this->super_CVmObjCollection).super_CVmObject.ext_;
LAB_0029c3ab:
    uVar2 = *(undefined4 *)&(undo_rec->oldval).field_0x4;
    aVar1 = (undo_rec->oldval).val;
    (pvVar3->val).typ = (undo_rec->oldval).typ;
    *(undefined4 *)&(pvVar3->val).field_0x4 = uVar2;
    (pvVar3->val).val = aVar1;
  }
  free(__ptr);
  (undo_rec->id).ptrval = (void *)0x0;
  return;
}

Assistant:

void CVmObjLookupTable::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        lookuptab_undo_rec *rec;

        /* get our private record from the standard undo record */
        rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;
    
        /* check the action in the record */
        switch(rec->action)
        {
        case LOOKUPTAB_UNDO_NULL:
            /* 
             *   null record, which means that it had a weak reference to an
             *   object that has been deleted - there's no way to reinstate
             *   such records, so ignore it 
             */
            break;
            
        case LOOKUPTAB_UNDO_ADD:
            /* we added the entry, so we must now delete it */
            del_entry(vmg_ &rec->key);
            break;

        case LOOKUPTAB_UNDO_DEL:
            /* we deleted the entry, so we must now add it */
            add_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_MOD:
            /* we modified the entry, so we must change it back */
            mod_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_DEFVAL:
            /* we modified the default value; change it back */
            get_ext()->default_value = undo_rec->oldval;
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}